

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDsdGlobal(Abc_Ntk_t *pNtk,int fVerbose,int fPrint,int fShort)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  int *piVar4;
  ulong uVar5;
  DdNode **pbFuncs;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  DdManager *pDVar10;
  uint *__ptr;
  void *pvVar11;
  undefined8 uVar12;
  Dsd_Manager_t *pDsdMan;
  Abc_Ntk_t *pNtk_00;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar13;
  Abc_Obj_t *pAVar14;
  Dsd_Node_t *pDVar15;
  Dsd_Node_t **__ptr_00;
  Vec_Ptr_t *pVVar16;
  char **pInputNames;
  char **pOutputNames;
  Abc_Ntk_t *pAVar17;
  long lVar18;
  uint uVar19;
  char *__assertion;
  int iVar20;
  long lVar21;
  int local_4c;
  DdManager *local_48;
  long local_40;
  Abc_Ntk_t *local_38;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                  ,0x45,"Abc_Ntk_t *Abc_NtkDsdGlobal(Abc_Ntk_t *, int, int, int)");
  }
  pDVar10 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,fVerbose);
  if (pDVar10 != (DdManager *)0x0) {
    local_48 = pDVar10;
    if (fVerbose != 0) {
      uVar7 = Cudd_ReadKeys(pDVar10);
      uVar8 = Cudd_ReadDead(pDVar10);
      printf("Shared BDD size = %6d nodes.\n",(ulong)(uVar7 - uVar8));
    }
    pVVar16 = pNtk->vCos;
    uVar7 = pVVar16->nSize;
    __ptr = (uint *)malloc(0x10);
    uVar8 = 8;
    if (6 < uVar7 - 1) {
      uVar8 = uVar7;
    }
    __ptr[1] = 0;
    *__ptr = uVar8;
    if (uVar8 == 0) {
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = malloc((long)(int)uVar8 << 3);
    }
    *(void **)(__ptr + 2) = pvVar11;
    if (0 < (int)uVar7) {
      lVar18 = 0;
      local_38 = pNtk;
      do {
        plVar3 = (long *)pVVar16->pArray[lVar18];
        if (*(int *)(*(long *)(*plVar3 + 0x1b0) + 4) < 8) goto LAB_00252a2a;
        piVar4 = *(int **)(*(long *)(*(long *)(*plVar3 + 0x1b0) + 8) + 0x38);
        if (*(void **)(piVar4 + 2) == (void *)0x0) {
          __assert_fail("p->pArrayPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                        ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
        }
        iVar9 = (int)plVar3[2];
        lVar21 = (long)iVar9;
        iVar1 = *piVar4;
        if (iVar1 <= iVar9) {
          iVar20 = iVar9 + 10;
          if (iVar9 < iVar1 * 2) {
            iVar20 = iVar1 * 2;
          }
          if (iVar1 < iVar20) {
            local_40 = lVar18;
            pvVar11 = realloc(*(void **)(piVar4 + 2),(long)iVar20 * 8);
            *(void **)(piVar4 + 2) = pvVar11;
            memset((void *)((long)pvVar11 + (long)*piVar4 * 8),0,((long)iVar20 - (long)*piVar4) * 8)
            ;
            *piVar4 = iVar20;
            lVar18 = local_40;
          }
        }
        if ((*(long *)(*(long *)(piVar4 + 2) + lVar21 * 8) == 0) &&
           (*(code **)(piVar4 + 8) != (code *)0x0)) {
          uVar12 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
          *(undefined8 *)(*(long *)(piVar4 + 2) + lVar21 * 8) = uVar12;
        }
        pNtk = local_38;
        uVar7 = *(uint *)((long)plVar3 + 0x14);
        uVar5 = *(ulong *)(*(long *)(piVar4 + 2) + lVar21 * 8);
        uVar8 = __ptr[1];
        uVar2 = *__ptr;
        if (uVar8 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar11 = malloc(0x80);
            }
            else {
              pvVar11 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar19 = 0x10;
          }
          else {
            uVar19 = uVar2 * 2;
            if ((int)uVar19 <= (int)uVar2) goto LAB_002526f0;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar11 = malloc((ulong)uVar2 << 4);
            }
            else {
              pvVar11 = realloc(*(void **)(__ptr + 2),(ulong)uVar2 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar11;
          *__ptr = uVar19;
        }
LAB_002526f0:
        __ptr[1] = uVar8 + 1;
        *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar8 * 8) = uVar7 >> 10 & 1 ^ uVar5;
        lVar18 = lVar18 + 1;
        pVVar16 = pNtk->vCos;
      } while (lVar18 < pVVar16->nSize);
    }
    if (pNtk->vAttrs->nSize < 8) {
LAB_00252a2a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pDVar10 = *(DdManager **)((long)pNtk->vAttrs->pArray[7] + 0x10);
    pDsdMan = Dsd_ManagerStart(pDVar10,pNtk->vCis->nSize,fVerbose);
    pbFuncs = *(DdNode ***)(__ptr + 2);
    if (pDsdMan == (Dsd_Manager_t *)0x0) {
      if (pbFuncs != (DdNode **)0x0) {
        free(pbFuncs);
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      Cudd_Quit(pDVar10);
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    else {
      Dsd_Decompose(pDsdMan,pbFuncs,pNtk->vCos->nSize);
      if (pbFuncs != (DdNode **)0x0) {
        free(pbFuncs);
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      Abc_NtkFreeGlobalBdds(pNtk,0);
      pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
      Cudd_bddIthVar((DdManager *)pNtk_00->pManFunc,pDVar10->size + -1);
      aVar13.pCopy = Abc_NtkCreateNodeConst1(pNtk_00);
      pAVar14 = Abc_AigConst1(pNtk);
      pAVar14->field_6 = aVar13;
      pDVar15 = Dsd_ManagerReadConst1(pDsdMan);
      Dsd_NodeSetMark(pDVar15,aVar13.iTemp);
      pVVar16 = pNtk->vCis;
      if (0 < pVVar16->nSize) {
        lVar18 = 0;
        do {
          pvVar11 = pVVar16->pArray[lVar18];
          pDVar15 = Dsd_ManagerReadInput(pDsdMan,(int)lVar18);
          Dsd_NodeSetMark(pDVar15,*(int *)((long)pvVar11 + 0x40));
          lVar18 = lVar18 + 1;
          pVVar16 = pNtk->vCis;
        } while (lVar18 < pVVar16->nSize);
      }
      __ptr_00 = Dsd_TreeCollectNodesDfs(pDsdMan,&local_4c);
      if (0 < local_4c) {
        lVar18 = 0;
        do {
          Abc_NtkDsdConstructNode(pDsdMan,__ptr_00[lVar18],pNtk_00,(int *)0x0);
          lVar18 = lVar18 + 1;
        } while (lVar18 < local_4c);
      }
      if (__ptr_00 != (Dsd_Node_t **)0x0) {
        free(__ptr_00);
      }
      pVVar16 = pNtk->vCos;
      if (0 < pVVar16->nSize) {
        lVar18 = 0;
        do {
          puVar6 = *(undefined8 **)
                    (*(long *)(*(long *)(*pVVar16->pArray[lVar18] + 0x20) + 8) +
                    (long)**(int **)((long)pVVar16->pArray[lVar18] + 0x20) * 8);
          if ((*(uint *)((long)puVar6 + 0x14) & 0xf) == 7) {
            if (((ulong)puVar6 & 1) != 0) {
              __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_00252a78:
              __assert_fail(__assertion,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                            ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
            }
            if (*(int *)*puVar6 != 3) {
              __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
              goto LAB_00252a78;
            }
            if (*(int *)((long)puVar6 + 0x1c) == 2) {
              pDVar15 = Dsd_ManagerReadRoot(pDsdMan,(int)lVar18);
              uVar7 = Dsd_NodeReadMark((Dsd_Node_t *)((ulong)pDVar15 & 0xfffffffffffffffe));
              if ((uVar7 & 1) != 0) {
                __assert_fail("!Abc_ObjIsComplement(pNodeNew)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDsd.c"
                              ,0xc9,
                              "void Abc_NtkDsdConstruct(Dsd_Manager_t *, Abc_Ntk_t *, Abc_Ntk_t *)")
                ;
              }
              puVar6[8] = (ulong)((uint)pDVar15 & 1) | (long)(int)uVar7;
            }
          }
          lVar18 = lVar18 + 1;
          pVVar16 = pNtk->vCos;
        } while (lVar18 < pVVar16->nSize);
      }
      Abc_NtkFinalize(pNtk,pNtk_00);
      Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
      if (fPrint != 0) {
        pInputNames = Abc_NtkCollectCioNames(pNtk,0);
        pOutputNames = Abc_NtkCollectCioNames(pNtk,1);
        if (fVerbose == 0) {
          Dsd_TreePrint2(_stdout,pDsdMan,pInputNames,pOutputNames,-1);
        }
        else {
          Dsd_TreePrint(_stdout,pDsdMan,pInputNames,pOutputNames,fShort,-1);
        }
        if (pInputNames != (char **)0x0) {
          free(pInputNames);
        }
        if (pOutputNames != (char **)0x0) {
          free(pOutputNames);
        }
      }
      Dsd_ManagerStop(pDsdMan);
    }
    Extra_StopManager(local_48);
    if (pNtk_00 != (Abc_Ntk_t *)0x0) {
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar17 = Abc_NtkDup(pNtk->pExdc);
        pNtk_00->pExdc = pAVar17;
      }
      iVar9 = Abc_NtkCheck(pNtk_00);
      if (iVar9 != 0) {
        return pNtk_00;
      }
      puts("Abc_NtkDsdGlobal: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkDsdGlobal( Abc_Ntk_t * pNtk, int fVerbose, int fPrint, int fShort )
{
    DdManager * dd;
    Abc_Ntk_t * pNtkNew;
    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, fVerbose );
    if ( dd == NULL )
        return NULL;
    if ( fVerbose )
        printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
    // transform the result of mapping into a BDD network
    pNtkNew = Abc_NtkDsdInternal( pNtk, fVerbose, fPrint, fShort );
    Extra_StopManager( dd );
    if ( pNtkNew == NULL )
        return NULL;
    // copy EXDC network
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkDsdGlobal: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}